

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Zp_field.h
# Opt level: O0

int Gudhi::persistence_fields::Zp_field_element<7U,_unsigned_int,_void>::_get_inverse
              (Element_conflict element)

{
  int iVar1;
  int iVar2;
  int temp;
  int quotient;
  int x;
  int y;
  int A;
  int M;
  Element_conflict element_local;
  
  y = 7;
  quotient = 0;
  temp = 1;
  x = element;
  while (1 < x) {
    iVar2 = x % y;
    iVar1 = temp - (x / y) * quotient;
    temp = quotient;
    x = y;
    quotient = iVar1;
    y = iVar2;
  }
  if (temp < 0) {
    temp = temp + 7;
  }
  return temp;
}

Assistant:

static int _get_inverse(Element element) {
    // to solve: Ax + My = 1
    int M = characteristic;
    int A = element;
    int y = 0, x = 1;
    // extended euclidean division
    while (A > 1) {
      int quotient = A / M;
      int temp = M;

      M = A % M, A = temp;
      temp = y;

      y = x - quotient * y;
      x = temp;
    }

    if (x < 0) x += characteristic;

    return x;
  }